

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSolve2LinearConstraint.cpp
# Opt level: O1

void __thiscall
btSolve2LinearConstraint::resolveBilateralPairConstraint
          (btSolve2LinearConstraint *this,btRigidBody *body1,btRigidBody *body2,btMatrix3x3 *world2A
          ,btMatrix3x3 *world2B,btVector3 *invInertiaADiag,btScalar invMassA,btVector3 *linvelA,
          btVector3 *angvelA,btVector3 *rel_posA1,btVector3 *invInertiaBDiag,btScalar invMassB,
          btVector3 *linvelB,btVector3 *angvelB,btVector3 *rel_posA2,btScalar depthA,
          btVector3 *normalA,btVector3 *rel_posB1,btVector3 *rel_posB2,btScalar depthB,
          btVector3 *normalB,btScalar *imp0,btScalar *imp1)

{
  float fVar1;
  btScalar bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  btVector3 bVar7;
  btVector3 bVar8;
  btVector3 bVar9;
  float local_118;
  float fStack_114;
  float local_108;
  float local_f8;
  btJacobianEntry jacB;
  btJacobianEntry jacA;
  
  *imp0 = 0.0;
  *imp1 = 0.0;
  fVar1 = normalA->m_floats[2] * normalA->m_floats[2] +
          normalA->m_floats[0] * normalA->m_floats[0] + normalA->m_floats[1] * normalA->m_floats[1];
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  if (ABS(ABS(fVar1) + -1.0) < 1.1920929e-07) {
    btJacobianEntry::btJacobianEntry
              (&jacA,world2A,world2B,rel_posA1,rel_posA2,normalA,invInertiaADiag,invMassA,
               invInertiaBDiag,invMassB);
    btJacobianEntry::btJacobianEntry
              (&jacB,world2A,world2B,rel_posB1,rel_posB2,normalB,invInertiaADiag,invMassA,
               invInertiaBDiag,invMassB);
    bVar7 = btRigidBody::getVelocityInLocalPoint(body1,rel_posA1);
    bVar8 = btRigidBody::getVelocityInLocalPoint(body2,rel_posA1);
    local_118 = bVar7.m_floats[0];
    fStack_114 = bVar7.m_floats[1];
    fVar4 = local_118 - bVar8.m_floats[0];
    fVar5 = fStack_114 - bVar8.m_floats[1];
    local_f8 = bVar7.m_floats[2];
    fVar1 = normalA->m_floats[1];
    fVar3 = normalA->m_floats[0];
    fVar6 = normalA->m_floats[2];
    bVar7 = btRigidBody::getVelocityInLocalPoint(body1,rel_posB1);
    bVar9 = btRigidBody::getVelocityInLocalPoint(body2,rel_posB1);
    local_118 = bVar7.m_floats[0];
    fStack_114 = bVar7.m_floats[1];
    local_108 = bVar7.m_floats[2];
    fVar6 = depthA * *(float *)this -
            ((local_f8 - bVar8.m_floats[2]) * fVar6 + fVar3 * fVar4 + fVar5 * fVar1) *
            *(float *)(this + 4);
    fVar3 = depthB * *(float *)this -
            ((local_108 - bVar9.m_floats[2]) * normalB->m_floats[2] +
            normalB->m_floats[0] * (local_118 - bVar9.m_floats[0]) +
            (fStack_114 - bVar9.m_floats[1]) * normalB->m_floats[1]) * *(float *)(this + 4);
    bVar2 = btJacobianEntry::getNonDiagonal(&jacA,&jacB,invMassA,invMassB);
    fVar1 = 1.0 / (jacA.m_Adiag * jacB.m_Adiag - bVar2 * bVar2);
    *imp0 = fVar6 * jacA.m_Adiag * fVar1 - fVar3 * bVar2 * fVar1;
    fVar1 = fVar3 * jacB.m_Adiag * fVar1 - bVar2 * fVar6 * fVar1;
    *imp1 = fVar1;
    if (*imp0 <= 0.0) {
      *imp0 = 0.0;
      fVar1 = fVar3 / jacB.m_Adiag;
      *imp1 = fVar1;
    }
    if (fVar1 <= 0.0) {
      *imp1 = 0.0;
      *imp0 = fVar6 / jacA.m_Adiag;
      if (fVar6 / jacA.m_Adiag <= 0.0) {
        *imp0 = 0.0;
      }
    }
  }
  return;
}

Assistant:

void btSolve2LinearConstraint::resolveBilateralPairConstraint(
						btRigidBody* body1,
						btRigidBody* body2,
						const btMatrix3x3& world2A,
						const btMatrix3x3& world2B,
						
						const btVector3& invInertiaADiag,
						const btScalar invMassA,
						const btVector3& linvelA,const btVector3& angvelA,
						const btVector3& rel_posA1,
						const btVector3& invInertiaBDiag,
						const btScalar invMassB,
						const btVector3& linvelB,const btVector3& angvelB,
						const btVector3& rel_posA2,

					  btScalar depthA, const btVector3& normalA, 
					  const btVector3& rel_posB1,const btVector3& rel_posB2,
					  btScalar depthB, const btVector3& normalB, 
					  btScalar& imp0,btScalar& imp1)
{

	(void)linvelA;
	(void)linvelB;
	(void)angvelA;
	(void)angvelB;



	imp0 = btScalar(0.);
	imp1 = btScalar(0.);

	btScalar len = btFabs(normalA.length()) - btScalar(1.);
	if (btFabs(len) >= SIMD_EPSILON)
		return;

	btAssert(len < SIMD_EPSILON);


	//this jacobian entry could be re-used for all iterations
	btJacobianEntry jacA(world2A,world2B,rel_posA1,rel_posA2,normalA,invInertiaADiag,invMassA,
		invInertiaBDiag,invMassB);
	btJacobianEntry jacB(world2A,world2B,rel_posB1,rel_posB2,normalB,invInertiaADiag,invMassA,
		invInertiaBDiag,invMassB);
	
	//const btScalar vel0 = jacA.getRelativeVelocity(linvelA,angvelA,linvelB,angvelB);
	//const btScalar vel1 = jacB.getRelativeVelocity(linvelA,angvelA,linvelB,angvelB);

	const btScalar vel0 = normalA.dot(body1->getVelocityInLocalPoint(rel_posA1)-body2->getVelocityInLocalPoint(rel_posA1));
	const btScalar vel1 = normalB.dot(body1->getVelocityInLocalPoint(rel_posB1)-body2->getVelocityInLocalPoint(rel_posB1));

	// calculate rhs (or error) terms
	const btScalar dv0 = depthA  * m_tau - vel0 * m_damping;
	const btScalar dv1 = depthB  * m_tau - vel1 * m_damping;

	// dC/dv * dv = -C
	
	// jacobian * impulse = -error
	//

	//impulse = jacobianInverse * -error

	// inverting 2x2 symmetric system (offdiagonal are equal!)
	// 


	btScalar nonDiag = jacA.getNonDiagonal(jacB,invMassA,invMassB);
	btScalar	invDet = btScalar(1.0) / (jacA.getDiagonal() * jacB.getDiagonal() - nonDiag * nonDiag );
	
	//imp0 = dv0 * jacA.getDiagonal() * invDet + dv1 * -nonDiag * invDet;
	//imp1 = dv1 * jacB.getDiagonal() * invDet + dv0 * - nonDiag * invDet;

	imp0 = dv0 * jacA.getDiagonal() * invDet + dv1 * -nonDiag * invDet;
	imp1 = dv1 * jacB.getDiagonal() * invDet + dv0 * - nonDiag * invDet;

	//[a b]								  [d -c]
	//[c d] inverse = (1 / determinant) * [-b a] where determinant is (ad - bc)

	//[jA nD] * [imp0] = [dv0]
	//[nD jB]   [imp1]   [dv1]

	if ( imp0 > btScalar(0.0))
	{
		if ( imp1 > btScalar(0.0) )
		{
			//both positive
		}
		else
		{
			imp1 = btScalar(0.);

			// now imp0>0 imp1<0
			imp0 = dv0 / jacA.getDiagonal();
			if ( imp0 > btScalar(0.0) )
			{
			} else
			{
				imp0 = btScalar(0.);
			}
		}
	}
	else
	{
		imp0 = btScalar(0.);

		imp1 = dv1 / jacB.getDiagonal();
		if ( imp1 <= btScalar(0.0) )
		{
			imp1 = btScalar(0.);
			// now imp0>0 imp1<0
			imp0 = dv0 / jacA.getDiagonal();
			if ( imp0 > btScalar(0.0) )
			{
			} else
			{
				imp0 = btScalar(0.);
			}
		} else
		{
		}
	}
}